

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510.c
# Opt level: O1

MPP_RET hal_h265e_v510_wait(void *hal,HalEncTask *task)

{
  uint type;
  uint uVar1;
  anon_struct_4_2_8616aad8_for_synt_nal aVar2;
  MppPacket s;
  H265eV510RegSet *regs;
  uint *puVar3;
  undefined8 *param_00;
  MppCbCtx *ctx;
  MPP_RET MVar4;
  size_t sVar5;
  uint uVar6;
  long lVar7;
  uint len;
  EncOutParam param;
  HalEncTask *local_48;
  void *local_40;
  uint local_34;
  
  s = task->packet;
  uVar1 = *(uint *)(*(long *)((long)hal + 0x390) + 0xe9c);
  lVar7 = *(long *)((long)hal + (long)(task->flags).reg_idx * 8 + 0x80);
  regs = *(H265eV510RegSet **)(lVar7 + 0x18);
  sVar5 = mpp_packet_get_length(s);
  aVar2 = (regs->reg_frm).synt_nal;
  puVar3 = *(uint **)(lVar7 + 0x20);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) enter\n",(char *)0x0,0x941);
  }
  if ((task->flags).err == 0) {
    type = (uint)aVar2 & 0x3f;
    if (uVar1 == 0 || ((ulong)task->rc_task->frm & 4) != 0) {
      MVar4 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
      if (MVar4 == MPP_OK) {
        MVar4 = hal_h265e_vepu510_status_check(regs);
        if (MVar4 == MPP_OK) {
          task->hw_length = task->hw_length + puVar3[1];
          MVar4 = MPP_OK;
        }
      }
      else {
        _mpp_log_l(2,"hal_h265e_v510","poll cmd failed %d\n","hal_h265e_v510_wait",
                   (ulong)(uint)MVar4);
        MVar4 = MPP_ERR_VPUHW;
      }
      mpp_packet_add_segment_info(s,type,(RK_S32)sVar5,puVar3[1]);
    }
    else {
      param_00 = *(undefined8 **)((long)hal + 0xa0);
      local_48 = task;
      local_40 = mpp_packet_get_data(task->packet);
      uVar6 = 0;
      do {
        *param_00 = 0;
        *(undefined4 *)(param_00 + 1) = *(undefined4 *)((long)hal + 0x98);
        *(undefined4 *)((long)param_00 + 0xc) = 0;
        mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,param_00);
        if (0 < *(int *)((long)param_00 + 0xc)) {
          lVar7 = 0;
          do {
            uVar6 = *(uint *)((long)param_00 + lVar7 * 4 + 0x10);
            len = uVar6 & 0x7fffffff;
            local_34 = len;
            mpp_packet_add_segment_info(s,type,(int)sVar5,len);
            if ((uVar1 & 1) != 0) {
              ctx = *(MppCbCtx **)((long)hal + 0xa8);
              ctx->cmd = ((int)uVar6 >> 0x1f) + 0x202;
              local_34 = len;
              mpp_callback_f("hal_h265e_v510_wait",ctx,&local_48);
            }
            sVar5 = (size_t)((int)sVar5 + len);
            lVar7 = lVar7 + 1;
          } while (lVar7 < *(int *)((long)param_00 + 0xc));
          uVar6 = uVar6 >> 0x1f;
        }
      } while (uVar6 == 0);
      MVar4 = hal_h265e_vepu510_status_check(regs);
      if (MVar4 == MPP_OK) {
        task->hw_length = task->hw_length + puVar3[1];
      }
    }
    if (MVar4 != MPP_OK) {
      _mpp_log_l(2,"hal_h265e_v510","poll cmd failed %d status %d \n","hal_h265e_v510_wait",
                 (ulong)(uint)MVar4,(ulong)*puVar3);
    }
    if (((byte)hal_h265e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h265e_v510","(%d) leave\n",(char *)0x0,0x9bd);
    }
  }
  else {
    _mpp_log_l(2,"hal_h265e_v510","enc_task->flags.err %08x, return early","hal_h265e_v510_wait");
    MVar4 = MPP_NOK;
  }
  return MVar4;
}

Assistant:

MPP_RET hal_h265e_v510_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    H265eV510HalContext *ctx = (H265eV510HalContext *)hal;
    HalEncTask *enc_task = task;
    MppPacket pkt = enc_task->packet;
    RK_U32 split_out = ctx->cfg->split.split_out;
    RK_S32 task_idx = task->flags.reg_idx;
    Vepu510H265eFrmCfg *frm = ctx->frms[task_idx];
    H265eV510RegSet *regs = frm->regs_set;
    RK_U32 offset = mpp_packet_get_length(pkt);
    RK_U32 seg_offset = offset;
    H265eVepu510Frame *reg_frm = &regs->reg_frm;
    RK_U32 type = reg_frm->synt_nal.nal_unit_type;
    H265eV510StatusElem *elem = (H265eV510StatusElem *)frm->regs_ret;

    hal_h265e_enter();

    if (enc_task->flags.err) {
        hal_h265e_err("enc_task->flags.err %08x, return early",
                      enc_task->flags.err);
        return MPP_NOK;
    }

    /* if pass1 mode, it will disable split mode and the split out need to be disable */
    if (enc_task->rc_task->frm.save_pass1)
        split_out = 0;

    if (split_out) {
        EncOutParam param;
        RK_U32 slice_len = 0;
        RK_U32 slice_last = 0;
        MppDevPollCfg *poll_cfg = (MppDevPollCfg *)((char *)ctx->poll_cfgs);
        param.task = task;
        param.base = mpp_packet_get_data(task->packet);

        do {
            RK_S32 i = 0;
            poll_cfg->poll_type = 0;
            poll_cfg->poll_ret  = 0;
            poll_cfg->count_max = ctx->poll_slice_max;
            poll_cfg->count_ret = 0;

            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, poll_cfg);
            for (i = 0; i < poll_cfg->count_ret; i++) {
                slice_last = poll_cfg->slice_info[i].last;
                slice_len = poll_cfg->slice_info[i].length;
                param.length = slice_len;

                mpp_packet_add_segment_info(pkt, type, seg_offset, slice_len);
                seg_offset += slice_len;

                if (split_out & MPP_ENC_SPLIT_OUT_LOWDELAY) {
                    param.length = slice_len;
                    if (slice_last)
                        ctx->output_cb->cmd = ENC_OUTPUT_FINISH;
                    else
                        ctx->output_cb->cmd = ENC_OUTPUT_SLICE;

                    mpp_callback(ctx->output_cb, &param);
                }
            }
        } while (!slice_last);

        ret = hal_h265e_vepu510_status_check(regs);
        if (!ret)
            task->hw_length += elem->st.bs_lgth_l32;

    } else {
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        if (ret) {
            mpp_err_f("poll cmd failed %d\n", ret);
            ret = MPP_ERR_VPUHW;
        } else {
            ret = hal_h265e_vepu510_status_check(regs);
            if (!ret)
                task->hw_length += elem->st.bs_lgth_l32;
        }
        mpp_packet_add_segment_info(pkt, type, offset, elem->st.bs_lgth_l32);
    }

#ifdef DUMP_DATA
    static FILE *fp_fbd = NULL;
    static FILE *fp_fbh = NULL;
    static FILE *fp_dws = NULL;
    HalBuf *recon_buf;
    static RK_U32 frm_num = 0;
    H265eSyntax_new *syn = (H265eSyntax_new *)enc_task->syntax.data;
    recon_buf = hal_bufs_get_buf(ctx->dpb_bufs, syn->sp.recon_pic.slot_idx);
    char file_name[20] = "";
    size_t rec_size = mpp_buffer_get_size(recon_buf->buf[0]);
    size_t dws_size = mpp_buffer_get_size(recon_buf->buf[1]);

    void *ptr = mpp_buffer_get_ptr(recon_buf->buf[0]);
    void *dws_ptr = mpp_buffer_get_ptr(recon_buf->buf[1]);

    sprintf(&file_name[0], "fbd%d.bin", frm_num);
    if (fp_fbd != NULL) {
        fclose(fp_fbd);
        fp_fbd = NULL;
    } else {
        fp_fbd = fopen(file_name, "wb+");
    }
    if (fp_fbd) {
        fwrite(ptr + ctx->fbc_header_len, 1, rec_size - ctx->fbc_header_len, fp_fbd);
        fflush(fp_fbd);
    }

    sprintf(&file_name[0], "fbh%d.bin", frm_num);

    if (fp_fbh != NULL) {
        fclose(fp_fbh);
        fp_fbh = NULL;
    } else {
        fp_fbh = fopen(file_name, "wb+");
    }

    if (fp_fbh) {
        fwrite(ptr , 1, ctx->fbc_header_len, fp_fbh);
        fflush(fp_fbh);
    }

    sprintf(&file_name[0], "dws%d.bin", frm_num);

    if (fp_dws != NULL) {
        fclose(fp_dws);
        fp_dws = NULL;
    } else {
        fp_dws = fopen(file_name, "wb+");
    }

    if (fp_dws) {
        fwrite(dws_ptr , 1, dws_size, fp_dws);
        fflush(fp_dws);
    }
    frm_num++;
#endif
    if (ret)
        mpp_err_f("poll cmd failed %d status %d \n", ret, elem->hw_status);

    hal_h265e_leave();
    return ret;
}